

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::JunitReporter::StartTestCase(JunitReporter *this,TestCaseInfo *testInfo)

{
  Stats *pSVar1;
  string *className;
  string *name;
  TestCaseStats local_98;
  TestCaseInfo *local_18;
  TestCaseInfo *testInfo_local;
  JunitReporter *this_local;
  
  pSVar1 = this->m_currentStats;
  local_18 = testInfo;
  testInfo_local = (TestCaseInfo *)this;
  className = TestCaseInfo::getClassName_abi_cxx11_(testInfo);
  name = TestCaseInfo::getName_abi_cxx11_(local_18);
  TestCaseStats::TestCaseStats(&local_98,className,name);
  std::
  vector<Catch::JunitReporter::TestCaseStats,_std::allocator<Catch::JunitReporter::TestCaseStats>_>
  ::push_back(&pSVar1->m_testCaseStats,&local_98);
  TestCaseStats::~TestCaseStats(&local_98);
  return;
}

Assistant:

virtual void StartTestCase( const Catch::TestCaseInfo& testInfo ) {
            m_currentStats->m_testCaseStats.push_back( TestCaseStats( testInfo.getClassName(), testInfo.getName() ) );
        }